

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

void __thiscall
minja::IfNode::IfNode
          (IfNode *this,Location *loc,
          vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
          *c)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer ppVar2;
  
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR___cxa_pure_virtual_00202570;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (loc->source).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (loc->source).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->super_TemplateNode).location_.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_TemplateNode).location_.pos = loc->pos;
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_00202520;
  ppVar2 = (c->
           super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->cascade).
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (c->
       super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->cascade).
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  (this->cascade).
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (c->
       super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (c->
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (c->
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (c->
  super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TemplateNode(const Location & location) : location_(location) {}